

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.cc
# Opt level: O1

const_iterator __thiscall bloaty::RangeMap::FindContaining(RangeMap *this,uint64_t addr)

{
  _Rb_tree_node_base *p_Var1;
  const_iterator iter;
  uint64_t uVar2;
  const_iterator cVar3;
  _Rb_tree_node_base *p_Var4;
  
  cVar3._M_node = &(this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var4 = cVar3._M_node;
  for (p_Var1 = (this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 != (_Rb_tree_node_base *)0x0;
      p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) <= addr]) {
    if (addr < *(ulong *)(p_Var1 + 1)) {
      p_Var4 = p_Var1;
    }
  }
  if (((p_Var4 != (this->mappings_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) &&
      (iter._M_node = (_Base_ptr)std::_Rb_tree_decrement(p_Var4),
      *(ulong *)(iter._M_node + 1) <= addr)) &&
     (uVar2 = RangeEndUnknownLimit(this,iter,0xffffffffffffffff), addr < uVar2)) {
    cVar3._M_node = iter._M_node;
  }
  return (const_iterator)cVar3._M_node;
}

Assistant:

RangeMap::Map::const_iterator RangeMap::FindContaining(uint64_t addr) const {
  auto it = mappings_.upper_bound(addr);  // Entry directly after.
  if (it == mappings_.begin() || (--it, !EntryContains(it, addr))) {
    return mappings_.end();
  } else {
    return it;
  }
}